

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::objectivec::anon_unknown_0::Parser::ParseChunk
          (Parser *this,StringPiece chunk,string *out_error)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  string local_b0;
  undefined1 local_90 [8];
  StringPiece line;
  char *local_78;
  string local_60;
  undefined1 local_40 [8];
  StringPiece full_chunk;
  string *out_error_local;
  Parser *this_local;
  StringPiece chunk_local;
  
  chunk_local.ptr_ = (char *)chunk.length_;
  this_local = (Parser *)chunk.ptr_;
  full_chunk.length_ = (size_type)out_error;
  stringpiece_internal::StringPiece::StringPiece((StringPiece *)local_40);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    stringpiece_internal::StringPiece::operator_cast_to_string(&local_60,(StringPiece *)&this_local)
    ;
    std::__cxx11::string::operator+=((string *)&this->leftover_,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
              ((StringPiece *)&line.length_,&this->leftover_);
    local_40 = (undefined1  [8])line.length_;
    full_chunk.ptr_ = local_78;
  }
  else {
    local_40 = (undefined1  [8])this_local;
    full_chunk.ptr_ = chunk_local.ptr_;
  }
  stringpiece_internal::StringPiece::StringPiece((StringPiece *)local_90);
  do {
    bVar1 = ReadLine((StringPiece *)local_40,(StringPiece *)local_90);
    if (!bVar1) {
      bVar1 = stringpiece_internal::StringPiece::empty((StringPiece *)local_40);
      if (bVar1) {
        std::__cxx11::string::clear();
      }
      else {
        stringpiece_internal::StringPiece::operator_cast_to_string
                  (&local_b0,(StringPiece *)local_40);
        std::__cxx11::string::operator=((string *)&this->leftover_,(string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
      }
      return true;
    }
    this->line_ = this->line_ + 1;
    RemoveComment((StringPiece *)local_90);
    TrimWhitespace((StringPiece *)local_90);
    bVar1 = stringpiece_internal::StringPiece::empty((StringPiece *)local_90);
  } while ((bVar1) ||
          (uVar2 = (*this->line_consumer_->_vptr_LineConsumer[2])
                             (this->line_consumer_,local_90,full_chunk.length_), (uVar2 & 1) != 0));
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    std::__cxx11::string::operator=
              ((string *)full_chunk.length_,"ConsumeLine failed without setting an error.");
  }
  std::__cxx11::string::clear();
  return false;
}

Assistant:

bool Parser::ParseChunk(StringPiece chunk, std::string* out_error) {
  StringPiece full_chunk;
  if (!leftover_.empty()) {
    leftover_ += std::string(chunk);
    full_chunk = StringPiece(leftover_);
  } else {
    full_chunk = chunk;
  }

  StringPiece line;
  while (ReadLine(&full_chunk, &line)) {
    ++line_;
    RemoveComment(&line);
    TrimWhitespace(&line);
    if (!line.empty() && !line_consumer_->ConsumeLine(line, out_error)) {
      if (out_error->empty()) {
        *out_error = "ConsumeLine failed without setting an error.";
      }
      leftover_.clear();
      return false;
    }
  }

  if (full_chunk.empty()) {
    leftover_.clear();
  } else {
    leftover_ = std::string(full_chunk);
  }
  return true;
}